

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

ostream * pstack::operator<<(ostream *os,JSON<pstack::Field<char[7],_char[9]>,_char> *o)

{
  ostream *poVar1;
  JSON<const_char_*,_char> local_48;
  char (*local_38) [9];
  char local_29;
  
  local_38 = (char (*) [9])o->object->k;
  local_48.context = &local_29;
  local_29 = '\0';
  local_48.object = (char **)&local_38;
  poVar1 = operator<<(os,&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  local_48.context = o->context;
  local_38 = o->object->v;
  local_48.object = (char **)&local_38;
  poVar1 = operator<<(poVar1,&local_48);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}